

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_cleanup(qpdf_data *qpdf)

{
  _qpdf_data *this;
  element_type *peVar1;
  element_type *peVar2;
  element_type *this_00;
  Pipeline *pPVar3;
  element_type *peVar4;
  char *cstr;
  shared_ptr<QPDFLogger> local_30;
  QPDFLogger local_20;
  qpdf_data *local_10;
  qpdf_data *qpdf_local;
  
  local_10 = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_cleanup",0);
  qpdf_oh_release_all(*local_10);
  peVar1 = std::__shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>::get
                     (&((*local_10)->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (peVar1 != (element_type *)0x0) {
    QTC::TC("qpdf","qpdf-c cleanup warned about unhandled error",0);
    QPDFLogger::defaultLogger();
    peVar2 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&local_30);
    QPDFLogger::getWarn(&local_20,SUB81(peVar2,0));
    this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_20);
    pPVar3 = Pipeline::operator<<(this_00,"WARNING: application did not handle error: ");
    peVar4 = std::__shared_ptr_access<QPDFExc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<QPDFExc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &(*local_10)->error);
    cstr = (char *)(**(code **)(*(long *)peVar4 + 0x10))();
    pPVar3 = Pipeline::operator<<(pPVar3,cstr);
    Pipeline::operator<<(pPVar3,"\n");
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_20);
    std::shared_ptr<QPDFLogger>::~shared_ptr(&local_30);
  }
  this = *local_10;
  if (this != (_qpdf_data *)0x0) {
    _qpdf_data::~_qpdf_data(this);
    operator_delete(this,0x148);
  }
  *local_10 = (qpdf_data)0x0;
  return;
}

Assistant:

void
qpdf_cleanup(qpdf_data* qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_cleanup");
    qpdf_oh_release_all(*qpdf);
    if ((*qpdf)->error.get()) {
        QTC::TC("qpdf", "qpdf-c cleanup warned about unhandled error");
        *QPDFLogger::defaultLogger()->getWarn()
            << "WARNING: application did not handle error: " << (*qpdf)->error->what() << "\n";
    }
    delete *qpdf;
    *qpdf = nullptr;
}